

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

void __thiscall
slang::ast::SampledValueExprVisitor::visit<slang::ast::RangeSelectExpression>
          (SampledValueExprVisitor *this,RangeSelectExpression *expr)

{
  ExpressionKind EVar1;
  Type *this_00;
  Symbol *pSVar2;
  iterator iVar3;
  Type *pTVar4;
  string_view sVar5;
  string_view local_28;
  
  EVar1 = (expr->super_Expression).kind;
  if (EVar1 == Call) {
    if (*(char *)&expr[1].super_Expression.constant == '\x01') {
      sVar5 = CallExpression::getSubroutineName((CallExpression *)expr);
      if (((sVar5._M_len == 7) &&
          (*(int *)((long)sVar5._M_str + 3) == 0x64656863 && *(int *)sVar5._M_str == 0x6374616d)) &&
         (expr[1].super_Expression.sourceRange.endLoc != (SourceLocation)0x0)) {
        this_00 = *(Type **)(*(long *)expr[1].super_Expression.sourceRange.startLoc + 8);
        if (this_00 == (Type *)0x0) {
          assert::assertFailed
                    ("ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                     ,0x26,
                     "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                    );
        }
        pTVar4 = this_00->canonical;
        if (pTVar4 == (Type *)0x0) {
          Type::resolveCanonical(this_00);
          pTVar4 = this_00->canonical;
        }
        if ((pTVar4->super_Symbol).kind == SequenceType) {
          ASTContext::addDiag(this->context,this->matchedCode,(expr->super_Expression).sourceRange);
        }
      }
      if (this->isFutureGlobal == true) {
        local_28 = CallExpression::getSubroutineName((CallExpression *)expr);
        iVar3 = ska::detailv3::
                sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                ::find(&FutureGlobalNames.
                        super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                       ,&local_28);
        if (iVar3.current !=
            FutureGlobalNames.
            super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            .entries +
            FutureGlobalNames.
            super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            .num_slots_minus_one +
            (long)FutureGlobalNames.
                  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  .max_lookups) {
          ASTContext::addDiag(this->context,(DiagCode)0x180008,(expr->super_Expression).sourceRange)
          ;
        }
      }
    }
  }
  else {
    if (EVar1 != NamedValue) {
      RangeSelectExpression::visitExprs<slang::ast::SampledValueExprVisitor&>(expr,this);
      return;
    }
    pSVar2 = Expression::getSymbolReference(&expr->super_Expression,true);
    if ((pSVar2 != (Symbol *)0x0) &&
       ((pSVar2->kind == LocalAssertionVar ||
        ((pSVar2->kind == AssertionPort && (*(char *)((long)&pSVar2[2].name._M_len + 4) == '\x01')))
        ))) {
      ASTContext::addDiag(this->context,this->localVarCode,(expr->super_Expression).sourceRange);
      return;
    }
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                    if (auto sym = expr.getSymbolReference()) {
                        if (sym->kind == SymbolKind::LocalAssertionVar ||
                            (sym->kind == SymbolKind::AssertionPort &&
                             sym->template as<AssertionPortSymbol>().isLocalVar())) {
                            context.addDiag(localVarCode, expr.sourceRange);
                        }
                    }
                    break;
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    if (call.isSystemCall()) {
                        if (call.getSubroutineName() == "matched"sv && !call.arguments().empty() &&
                            call.arguments()[0]->type->isSequenceType()) {
                            context.addDiag(matchedCode, expr.sourceRange);
                        }

                        if (isFutureGlobal && FutureGlobalNames.count(call.getSubroutineName())) {
                            context.addDiag(diag::GlobalSampledValueNested, expr.sourceRange);
                        }
                    }
                    break;
                }
                default:
                    if constexpr (is_detected_v<ASTDetectors::visitExprs_t, T,
                                                SampledValueExprVisitor>)
                        expr.visitExprs(*this);
                    break;
            }
        }
    }